

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d.h
# Opt level: O3

Array2D<interval> * __thiscall
TNT::Array2D<interval>::ref(Array2D<interval> *this,Array2D<interval> *A)

{
  int *piVar1;
  interval **ppiVar2;
  interval *piVar3;
  int iVar4;
  
  if (this != A) {
    piVar1 = (this->v_).v_.ref_count_;
    if ((piVar1 != (int *)0x0) && (*piVar1 = *piVar1 + -1, *piVar1 == 0)) {
      operator_delete(piVar1,4);
      ppiVar2 = (this->v_).v_.data_;
      if (ppiVar2 != (interval **)0x0) {
        operator_delete__(ppiVar2);
      }
      (this->v_).v_.data_ = (interval **)0x0;
    }
    (this->v_).v_.data_ = (A->v_).v_.data_;
    piVar1 = (A->v_).v_.ref_count_;
    (this->v_).v_.ref_count_ = piVar1;
    if (piVar1 != (int *)0x0) {
      *piVar1 = *piVar1 + 1;
    }
    (this->v_).n_ = (A->v_).n_;
    (this->v_).data_ = (A->v_).data_;
    piVar1 = (this->data_).v_.ref_count_;
    if ((piVar1 != (int *)0x0) && (*piVar1 = *piVar1 + -1, *piVar1 == 0)) {
      operator_delete(piVar1,4);
      piVar3 = (this->data_).v_.data_;
      if (piVar3 != (interval *)0x0) {
        operator_delete__(piVar3);
      }
      (this->data_).v_.data_ = (interval *)0x0;
    }
    (this->data_).v_.data_ = (A->data_).v_.data_;
    piVar1 = (A->data_).v_.ref_count_;
    (this->data_).v_.ref_count_ = piVar1;
    if (piVar1 != (int *)0x0) {
      *piVar1 = *piVar1 + 1;
    }
    (this->data_).n_ = (A->data_).n_;
    (this->data_).data_ = (A->data_).data_;
    iVar4 = A->n_;
    this->m_ = A->m_;
    this->n_ = iVar4;
  }
  return this;
}

Assistant:

Array2D<T> & Array2D<T>::ref(const Array2D<T> &A)
{
	if (this != &A)
	{
		v_ = A.v_;
		data_ = A.data_;
		m_ = A.m_;
		n_ = A.n_;
		
	}
	return *this;
}